

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  byte bVar1;
  sqlite3 *db;
  sqlite3 *db_00;
  VdbeOp *pVVar2;
  u8 uVar3;
  int iVar4;
  TriggerPrg *pTVar5;
  SubProgram *pSVar6;
  Parse *pParse_00;
  Vdbe *pVVar7;
  char *pcVar8;
  Expr *pEVar9;
  SrcList *pSVar10;
  ExprList *pEVar11;
  Select *pSVar12;
  ExprList *pSet;
  Upsert *pUVar13;
  Parse *pWhere;
  int dest;
  Parse *pPVar14;
  Expr *in_R8;
  TriggerStep *pStep;
  Expr *in_stack_fffffffffffffef8;
  Vdbe *pVVar15;
  Expr *local_c0;
  NameContext local_88;
  SelectDest local_50;
  
  pPVar14 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar14 = pParse;
  }
  pTVar5 = pPVar14->pTriggerPrg;
  while( true ) {
    if (pTVar5 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar5 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar5 != (TriggerPrg *)0x0) {
        pTVar5->pNext = pPVar14->pTriggerPrg;
        pPVar14->pTriggerPrg = pTVar5;
        pSVar6 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
        pTVar5->pProgram = pSVar6;
        if (pSVar6 != (SubProgram *)0x0) {
          pVVar7 = pPVar14->pVdbe;
          pSVar6->pNext = pVVar7->pProgram;
          pVVar7->pProgram = pSVar6;
          pTVar5->pTrigger = pTrigger;
          pTVar5->orconf = orconf;
          pTVar5->aColmask[0] = 0xffffffff;
          pTVar5->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x1a0);
          if (pParse_00 != (Parse *)0x0) {
            local_88.pSrcList = (SrcList *)0x0;
            local_88.nRef = 0;
            local_88.nErr = 0;
            local_88.ncFlags = 0;
            local_88._42_6_ = 0;
            local_88.uNC.pEList = (ExprList *)0x0;
            local_88.pNext = (NameContext *)0x0;
            local_88.pWinSelect = (Select *)0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar14;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            pParse_00->disableVtab = pParse->disableVtab;
            pWhere = pParse;
            local_88.pParse = pParse_00;
            pVVar7 = sqlite3GetVdbe(pParse_00);
            if (pVVar7 != (Vdbe *)0x0) {
              if (pTrigger->zName != (char *)0x0) {
                pcVar8 = sqlite3MPrintf(db,"-- TRIGGER %s");
                pWhere = (Parse *)0xfffffff9;
                sqlite3VdbeChangeP4(pVVar7,-1,pcVar8,-7);
              }
              if (pTrigger->pWhen == (Expr *)0x0) {
                dest = 0;
              }
              else {
                dest = 0;
                pWhere = (Parse *)0x0;
                pEVar9 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar4 = sqlite3ResolveExprNames(&local_88,pEVar9);
                if ((iVar4 == 0) && (db->mallocFailed == '\0')) {
                  dest = pParse_00->nLabel + -1;
                  pParse_00->nLabel = dest;
                  pWhere = (Parse *)0x10;
                  sqlite3ExprIfFalse(pParse_00,pEVar9,dest,0x10);
                }
                if (pEVar9 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,pEVar9);
                }
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                db_00 = pParse_00->db;
                pVVar15 = pParse_00->pVdbe;
                do {
                  uVar3 = (u8)orconf;
                  if (orconf == 0xb) {
                    uVar3 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar3;
                  if (pStep->zSpan != (char *)0x0) {
                    pcVar8 = sqlite3MPrintf(db_00,"-- %s");
                    in_R8 = (Expr *)0x0;
                    iVar4 = sqlite3VdbeAddOp3(pVVar15,0xa8,0x7fffffff,1,0);
                    pWhere = (Parse *)0xfffffff9;
                    sqlite3VdbeChangeP4(pVVar15,iVar4,pcVar8,-7);
                  }
                  uVar3 = pStep->op;
                  if (uVar3 == 'x') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pSVar12 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    pWhere = (Parse *)sqlite3IdListDup(db_00,pStep->pIdList);
                    bVar1 = pParse_00->eOrconf;
                    pUVar13 = pStep->pUpsert;
                    if (pUVar13 == (Upsert *)0x0) {
                      pUVar13 = (Upsert *)0x0;
                    }
                    else {
                      pEVar11 = sqlite3ExprListDup(db_00,pUVar13->pUpsertTarget,0);
                      if (pUVar13->pUpsertTargetWhere == (Expr *)0x0) {
                        local_c0 = (Expr *)0x0;
                      }
                      else {
                        local_c0 = exprDup(db_00,pUVar13->pUpsertTargetWhere,0,(u8 **)0x0);
                      }
                      pSet = sqlite3ExprListDup(db_00,pUVar13->pUpsertSet,0);
                      if (pUVar13->pUpsertWhere == (Expr *)0x0) {
                        pEVar9 = (Expr *)0x0;
                      }
                      else {
                        pEVar9 = exprDup(db_00,pUVar13->pUpsertWhere,0,(u8 **)0x0);
                      }
                      pUVar13 = sqlite3UpsertNew(db_00,pEVar11,local_c0,pSet,pEVar9);
                    }
                    in_R8 = (Expr *)(ulong)bVar1;
                    sqlite3Insert(pParse_00,pSVar10,pSVar12,(IdList *)pWhere,(uint)bVar1,pUVar13);
                  }
                  else if (uVar3 == 'y') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pEVar9 = (Expr *)0x0;
                    }
                    else {
                      pWhere = (Parse *)0x0;
                      pEVar9 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    sqlite3DeleteFrom(pParse_00,pSVar10,pEVar9,(ExprList *)pWhere,in_R8);
                  }
                  else if (uVar3 == 'z') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pEVar11 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pWhere = (Parse *)0x0;
                    }
                    else {
                      pWhere = (Parse *)exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    in_R8 = (Expr *)(ulong)pParse_00->eOrconf;
                    sqlite3Update(pParse_00,pSVar10,pEVar11,(Expr *)pWhere,(uint)pParse_00->eOrconf,
                                  (ExprList *)0x0,in_stack_fffffffffffffef8,(Upsert *)pVVar7);
                  }
                  else {
                    pSVar12 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    local_50.eDest = '\x04';
                    local_50.iSDParm = 0;
                    local_50.iSdst = 0;
                    local_50._12_8_ = 0;
                    local_50.zAffSdst._4_4_ = 0;
                    sqlite3Select(pParse_00,pSVar12,&local_50);
                    if (pSVar12 != (Select *)0x0) {
                      clearSelect(db_00,pSVar12,1);
                    }
                  }
                  if (pStep->op != 0x83) {
                    pWhere = (Parse *)0x0;
                    in_R8 = (Expr *)0x0;
                    sqlite3VdbeAddOp3(pVVar15,0x7c,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              pVVar15 = pVVar7;
              if (dest != 0) {
                sqlite3VdbeResolveLabel(pVVar7,dest);
              }
              sqlite3VdbeAddOp3(pVVar7,0x45,0,0,0);
              pcVar8 = pParse_00->zErrMsg;
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pcVar8;
                pParse->nErr = pParse_00->nErr;
                pParse->rc = pParse_00->rc;
              }
              else if (pcVar8 != (char *)0x0) {
                sqlite3DbFreeNN(pParse_00->db,pcVar8);
              }
              if ((db->mallocFailed == '\0') && (pParse->nErr == 0)) {
                pVVar2 = pVVar15->aOp;
                pVVar7 = pVVar15;
                resolveP2Values(pVVar15,&pPVar14->nMaxArg);
                pSVar6->nOp = pVVar7->nOp;
                pVVar7->aOp = (Op *)0x0;
                pSVar6->aOp = pVVar2;
              }
              pSVar6->nMem = pParse_00->nMem;
              pSVar6->nCsr = pParse_00->nTab;
              pSVar6->token = pTrigger;
              pTVar5->aColmask[0] = pParse_00->oldmask;
              pTVar5->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar7);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFreeNN(db,pParse_00);
            return pTVar5;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar5->pTrigger == pTrigger) && (pTVar5->orconf == orconf)) break;
    pTVar5 = pTVar5->pNext;
  }
  return pTVar5;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}